

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O3

bool_t priExtendPrime(word *p,size_t l,word *q,size_t n,size_t trials,size_t base_count,gen_i rng,
                     void *rng_state,void *stack)

{
  bool_t bVar1;
  
  *(undefined8 *)stack = 1;
  bVar1 = priExtendPrime2(p,l,q,n,(word *)stack,1,trials,base_count,rng,rng_state,
                          (void *)((long)stack + 8));
  return bVar1;
}

Assistant:

bool_t priExtendPrime(word p[], size_t l, const word q[], size_t n,
	size_t trials, size_t base_count, gen_i rng, void* rng_state, void* stack)
{
	word* a;
	// pre
	ASSERT(memIsValid(stack, O_OF_W(1)));
	// a <- 1
	a = (word*)stack;
	a[0] = 1;
	// расширить
	return priExtendPrime2(p, l, q, n, a, 1, trials, base_count, 
		rng, rng_state, a + 1);
}